

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

void ctl_refresh(tsdn_t *tsdn)

{
  long lVar1;
  arena_t *paVar2;
  undefined8 uStackY_1f0;
  undefined1 auStackY_1e8 [4];
  uint uStackY_1e4;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  atomic_zu_t *apaStack_1d8 [2];
  undefined1 uStack_1c5;
  uint uStack_1c4;
  ctl_arena_stats_t *apcStack_1c0 [2];
  undefined4 uStack_1ac;
  atomic_zu_t *paStack_1a8;
  undefined8 uStack_1a0;
  undefined4 uStack_194;
  atomic_zu_t *paStack_190;
  undefined8 uStack_188;
  undefined4 uStack_17c;
  size_t sStack_178;
  atomic_zu_t *paStack_170;
  undefined8 uStack_168;
  undefined4 uStack_15c;
  atomic_zu_t *paStack_158;
  undefined8 uStack_150;
  undefined4 uStack_144;
  size_t local_140;
  atomic_zu_t *local_138;
  undefined8 local_130;
  undefined1 *local_128;
  bool local_119;
  ctl_arena_t *pcStack_118;
  _Bool initialized;
  ctl_arena_t *ctl_arena;
  unsigned_long __vla_expr0;
  ctl_arena_t *local_100;
  ctl_arena_t *ctl_sarena;
  tsdn_t *ptStack_f0;
  uint i;
  tsdn_t *tsdn_local;
  size_t result_6;
  atomic_zu_t *paStack_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  size_t sStack_c8;
  size_t result_5;
  ctl_arena_stats_t *pcStack_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  size_t sStack_a8;
  size_t result_4;
  atomic_zu_t *paStack_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  size_t sStack_88;
  size_t result_3;
  atomic_zu_t *paStack_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  size_t sStack_68;
  size_t result_2;
  atomic_zu_t *paStack_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  size_t sStack_48;
  size_t result_1;
  atomic_zu_t *paStack_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  size_t sStack_28;
  size_t result;
  atomic_zu_t *local_18;
  undefined4 local_10;
  undefined4 uStack_c;
  
  uStackY_1f0 = 0x14595c;
  ptStack_f0 = tsdn;
  local_100 = arenas_i(CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  __vla_expr0 = (unsigned_long)auStackY_1e8;
  lVar1 = -((long)(ulong)ctl_arenas->narenas * 8 + 0xfU & 0xfffffffffffffff0);
  local_128 = auStackY_1e8 + lVar1;
  ctl_arena = (ctl_arena_t *)(ulong)ctl_arenas->narenas;
  *(undefined8 *)(auStackY_1e8 + lVar1 + -8) = 0x1459a6;
  ctl_arena_clear(*(ctl_arena_t **)(auStackY_1e8 + lVar1 + -8));
  for (ctl_sarena._4_4_ = 0; ctl_sarena._4_4_ < ctl_arenas->narenas;
      ctl_sarena._4_4_ = ctl_sarena._4_4_ + 1) {
    *(undefined8 *)(auStackY_1e8 + lVar1 + -8) = 0x1459d6;
    paVar2 = arena_get(*(tsdn_t **)((long)apcStack_1c0 + lVar1),*(uint *)((long)&uStack_1c4 + lVar1)
                       ,(_Bool)(&uStack_1c5)[lVar1]);
    *(arena_t **)(local_128 + (ulong)ctl_sarena._4_4_ * 8) = paVar2;
  }
  for (ctl_sarena._4_4_ = 0; ctl_sarena._4_4_ < ctl_arenas->narenas;
      ctl_sarena._4_4_ = ctl_sarena._4_4_ + 1) {
    *(undefined8 *)(auStackY_1e8 + lVar1 + -8) = 0x145a28;
    pcStack_118 = arenas_i(*(size_t *)(&stack0xfffffffffffffe20 + lVar1));
    local_119 = *(long *)(local_128 + (ulong)ctl_sarena._4_4_ * 8) != 0;
    pcStack_118->initialized = local_119;
    if (local_119) {
      *(undefined8 *)(auStackY_1e8 + lVar1 + -8) = 0x145a98;
      ctl_arena_refresh(*(tsdn_t **)((long)apaStack_1d8 + lVar1 + 8),
                        *(arena_t **)((long)apaStack_1d8 + lVar1),
                        *(ctl_arena_t **)(&stack0xfffffffffffffe20 + lVar1),
                        *(uint *)(auStackY_1e8 + lVar1 + 4),(_Bool)auStackY_1e8[lVar1 + 3]);
    }
  }
  local_140 = local_100->astats->allocated_small;
  local_18 = &(local_100->astats->astats).allocated_large;
  result._4_4_ = 0;
  local_138 = local_18;
  local_10 = 0;
  local_130 = 0;
  uStack_c = 0;
  uStack_144 = 0;
  sStack_28 = local_18->repr;
  ctl_stats->allocated = local_140 + sStack_28;
  ctl_stats->active = local_100->pactive << 0xc;
  paStack_38 = &(local_100->astats->astats).base;
  result_1._4_4_ = 0;
  paStack_158 = paStack_38;
  uStack_30 = 0;
  uStack_150 = 0;
  uStack_2c = 0;
  uStack_15c = 0;
  sStack_48 = paStack_38->repr;
  sStack_178 = sStack_48;
  paStack_58 = &(local_100->astats->astats).internal;
  result_2._4_4_ = 0;
  paStack_170 = paStack_58;
  uStack_50 = 0;
  uStack_168 = 0;
  uStack_4c = 0;
  uStack_17c = 0;
  sStack_68 = paStack_58->repr;
  ctl_stats->metadata = sStack_48 + sStack_68;
  paStack_78 = &(local_100->astats->astats).metadata_thp;
  result_3._4_4_ = 0;
  paStack_190 = paStack_78;
  uStack_70 = 0;
  uStack_188 = 0;
  uStack_6c = 0;
  uStack_194 = 0;
  sStack_88 = paStack_78->repr;
  ctl_stats->metadata_thp = sStack_88;
  paStack_98 = &(local_100->astats->astats).resident;
  result_4._4_4_ = 0;
  paStack_1a8 = paStack_98;
  uStack_90 = 0;
  uStack_1a0 = 0;
  uStack_8c = 0;
  uStack_1ac = 0;
  sStack_a8 = paStack_98->repr;
  ctl_stats->resident = sStack_a8;
  pcStack_b8 = local_100->astats;
  result_5._4_4_ = 0;
  apcStack_1c0[0] = pcStack_b8;
  uStack_b0 = 0;
  apcStack_1c0[1] = (ctl_arena_stats_t *)0x0;
  uStack_ac = 0;
  uStack_1c4 = 0;
  sStack_c8 = (pcStack_b8->astats).mapped.repr;
  ctl_stats->mapped = sStack_c8;
  paStack_d8 = &(local_100->astats->astats).retained;
  result_6._4_4_ = 0;
  apaStack_1d8[0] = paStack_d8;
  uStack_d0 = 0;
  apaStack_1d8[1] = (atomic_zu_t *)0x0;
  uStack_cc = 0;
  tsdn_local = (tsdn_t *)paStack_d8->repr;
  ctl_stats->retained = (size_t)tsdn_local;
  *(undefined **)(auStackY_1e8 + lVar1 + -8) = &UNK_00146150;
  ctl_background_thread_stats_read(*(tsdn_t **)(&stack0xfffffffffffffe20 + lVar1));
  *(undefined **)(auStackY_1e8 + lVar1 + -8) = &UNK_00146163;
  malloc_mutex_lock(*(tsdn_t **)(&stack0xfffffffffffffe38 + lVar1),
                    *(malloc_mutex_t **)((long)apaStack_1d8 + lVar1 + 8));
  *(undefined **)(auStackY_1e8 + lVar1 + -8) = &UNK_00146181;
  malloc_mutex_prof_read
            (*(tsdn_t **)((long)apcStack_1c0 + lVar1 + 8),
             *(mutex_prof_data_t **)((long)apcStack_1c0 + lVar1),
             *(malloc_mutex_t **)(&stack0xfffffffffffffe38 + lVar1));
  *(undefined **)(auStackY_1e8 + lVar1 + -8) = &UNK_00146194;
  malloc_mutex_unlock(*(tsdn_t **)((long)apaStack_1d8 + lVar1 + 8),
                      *(malloc_mutex_t **)((long)apaStack_1d8 + lVar1));
  *(undefined **)(auStackY_1e8 + lVar1 + -8) = &UNK_001461b6;
  malloc_mutex_prof_read
            (*(tsdn_t **)((long)apcStack_1c0 + lVar1 + 8),
             *(mutex_prof_data_t **)((long)apcStack_1c0 + lVar1),
             *(malloc_mutex_t **)(&stack0xfffffffffffffe38 + lVar1));
  ctl_arenas->epoch = ctl_arenas->epoch + 1;
  return;
}

Assistant:

static void
ctl_refresh(tsdn_t *tsdn) {
	unsigned i;
	ctl_arena_t *ctl_sarena = arenas_i(MALLCTL_ARENAS_ALL);
	VARIABLE_ARRAY(arena_t *, tarenas, ctl_arenas->narenas);

	/*
	 * Clear sum stats, since they will be merged into by
	 * ctl_arena_refresh().
	 */
	ctl_arena_clear(ctl_sarena);

	for (i = 0; i < ctl_arenas->narenas; i++) {
		tarenas[i] = arena_get(tsdn, i, false);
	}

	for (i = 0; i < ctl_arenas->narenas; i++) {
		ctl_arena_t *ctl_arena = arenas_i(i);
		bool initialized = (tarenas[i] != NULL);

		ctl_arena->initialized = initialized;
		if (initialized) {
			ctl_arena_refresh(tsdn, tarenas[i], ctl_sarena, i,
			    false);
		}
	}

	if (config_stats) {
		ctl_stats->allocated = ctl_sarena->astats->allocated_small +
		    atomic_load_zu(&ctl_sarena->astats->astats.allocated_large,
			ATOMIC_RELAXED);
		ctl_stats->active = (ctl_sarena->pactive << LG_PAGE);
		ctl_stats->metadata = atomic_load_zu(
		    &ctl_sarena->astats->astats.base, ATOMIC_RELAXED) +
		    atomic_load_zu(&ctl_sarena->astats->astats.internal,
			ATOMIC_RELAXED);
		ctl_stats->metadata_thp = atomic_load_zu(
		    &ctl_sarena->astats->astats.metadata_thp, ATOMIC_RELAXED);
		ctl_stats->resident = atomic_load_zu(
		    &ctl_sarena->astats->astats.resident, ATOMIC_RELAXED);
		ctl_stats->mapped = atomic_load_zu(
		    &ctl_sarena->astats->astats.mapped, ATOMIC_RELAXED);
		ctl_stats->retained = atomic_load_zu(
		    &ctl_sarena->astats->astats.retained, ATOMIC_RELAXED);

		ctl_background_thread_stats_read(tsdn);

#define READ_GLOBAL_MUTEX_PROF_DATA(i, mtx)				\
    malloc_mutex_lock(tsdn, &mtx);					\
    malloc_mutex_prof_read(tsdn, &ctl_stats->mutex_prof_data[i], &mtx);	\
    malloc_mutex_unlock(tsdn, &mtx);

		if (config_prof && opt_prof) {
			READ_GLOBAL_MUTEX_PROF_DATA(global_prof_mutex_prof,
			    bt2gctx_mtx);
		}
		if (have_background_thread) {
			READ_GLOBAL_MUTEX_PROF_DATA(
			    global_prof_mutex_background_thread,
			    background_thread_lock);
		} else {
			memset(&ctl_stats->mutex_prof_data[
			    global_prof_mutex_background_thread], 0,
			    sizeof(mutex_prof_data_t));
		}
		/* We own ctl mutex already. */
		malloc_mutex_prof_read(tsdn,
		    &ctl_stats->mutex_prof_data[global_prof_mutex_ctl],
		    &ctl_mtx);
#undef READ_GLOBAL_MUTEX_PROF_DATA
	}
	ctl_arenas->epoch++;
}